

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O2

void __thiscall
TEST_SimpleStringBuffer_setWriteLimit_Test::testBody
          (TEST_SimpleStringBuffer_setWriteLimit_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  char *pcVar3;
  TestTerminator *pTVar4;
  int iVar5;
  bool bVar6;
  SimpleString str;
  SimpleStringBuffer buffer;
  
  SimpleStringBuffer::SimpleStringBuffer(&buffer);
  SimpleStringBuffer::setWriteLimit(&buffer,10);
  iVar5 = 0x1000;
  while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
    SimpleStringBuffer::add(&buffer,"h");
  }
  SimpleString::SimpleString(&str,"h",10);
  pUVar1 = UtestShell::getCurrent();
  pcVar2 = SimpleString::asCharString(&str);
  pcVar3 = SimpleStringBuffer::toString(&buffer);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,pcVar2,pcVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x256,pTVar4);
  SimpleString::~SimpleString(&str);
  return;
}

Assistant:

TEST(SimpleStringBuffer, setWriteLimit)
{
    SimpleStringBuffer buffer;
    buffer.setWriteLimit(10);
    for (int i = 0; i < SimpleStringBuffer::SIMPLE_STRING_BUFFER_LEN ; i++)
        buffer.add("h");
    SimpleString str("h", 10);
    STRCMP_EQUAL(str.asCharString(), buffer.toString());
}